

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_utils.cc
# Opt level: O0

int __thiscall
lf::base::LineFeedFormatter::clone
          (LineFeedFormatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pfVar1;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_28;
  unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>
  local_20;
  __fn *local_18;
  LineFeedFormatter *this_local;
  
  local_18 = __fn;
  this_local = this;
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      (__fn + 8));
  (*pfVar1->_vptr_formatter[3])();
  std::
  make_unique<lf::base::LineFeedFormatter,std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_20);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<lf::base::LineFeedFormatter,std::default_delete<lf::base::LineFeedFormatter>,void>
            ((unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>> *)this,&local_20)
  ;
  std::unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>::
  ~unique_ptr(&local_20);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&local_28);
  return (int)this;
}

Assistant:

std::unique_ptr<spdlog::formatter> LineFeedFormatter::clone() const {
  return std::make_unique<LineFeedFormatter>(wrapped_formatter_->clone());
}